

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O1

bool __thiscall axl::io::ShmtBase::initializeMapping(ShmtBase *this,size_t size,bool isForced)

{
  File *this_00;
  int iVar1;
  uint64_t uVar2;
  ShmtFileHdr *pSVar3;
  ulong __length;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_58;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_38;
  undefined4 extraout_var;
  
  if ((g::getModule()::module == '\0') &&
     (iVar1 = __cxa_guard_acquire(&g::getModule()::module), iVar1 != 0)) {
    g::Module::Module((Module *)g::getModule()::module);
    __cxa_atexit(g::Module::~Module,g::getModule()::module,&__dso_handle);
    __cxa_guard_release(&g::getModule()::module);
  }
  __length = (g::getModule()::module._8_8_ + size) - size % (ulong)g::getModule()::module._8_8_;
  if (size % (ulong)g::getModule()::module._8_8_ == 0) {
    __length = size;
  }
  this_00 = &this->m_file;
  if (isForced) {
    iVar1 = ftruncate64((this_00->m_file).
                        super_Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>.m_h,
                        __length);
    if (iVar1 != -1) {
LAB_00126b1a:
      iVar1 = Mapping::open(&this->m_mapping,(char *)this_00,0,__length,0);
      pSVar3 = (ShmtFileHdr *)CONCAT44(extraout_var,iVar1);
      if (pSVar3 == (ShmtFileHdr *)0x0) {
        return pSVar3 != (ShmtFileHdr *)0x0;
      }
      this->m_hdr = pSVar3;
      this->m_data = (char *)(pSVar3 + 1);
      return true;
    }
    err::setLastSystemError();
  }
  else {
    uVar2 = psx::File::getSize(&this_00->m_file);
    if (__length <= uVar2) goto LAB_00126b1a;
    err::Error::Error((Error *)&local_38,0x16);
    local_58.m_p = (ErrorHdr *)0x0;
    local_58.m_hdr = (BufHdr *)0x0;
    local_58.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_58,&local_38);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_38);
    err::setError((ErrorRef *)&local_58);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_58);
  }
  return false;
}

Assistant:

bool
ShmtBase::initializeMapping(
	size_t size,
	bool isForced
) {
	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size_t remSize = size % systemInfo->m_pageSize;
	if (remSize)
		size = size - remSize + systemInfo->m_pageSize;

	if (isForced) {
		bool result = m_file.setSize(size);
		if (!result)
			return false;
	} else {
		uint64_t fileSize = m_file.getSize();
		if (fileSize < size) {
			err::setError(err::SystemErrorCode_InvalidParameter);
			return false;
		}
	}

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}